

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall Cache::loadBlockFromLowerLevel(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t *puVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint uVar3;
  Cache *this_01;
  sbyte sVar4;
  byte extraout_AL;
  uint8_t uVar5;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint32_t uVar6;
  uint addr_00;
  long lVar7;
  double in_XMM0_Qa;
  double __x;
  Block replace_block;
  allocator_type local_a9;
  undefined2 local_a8;
  undefined2 uStack_a6;
  uint32_t uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint32_t local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  undefined1 local_78 [16];
  pointer local_68;
  pointer local_60;
  uint8_t *local_48;
  pointer puStack_40;
  
  local_98 = 0;
  local_a8 = 1;
  uStack_a4 = getTag(this,addr);
  __x = log2(in_XMM0_Qa);
  log2(__x);
  sVar4 = (extraout_AL < 0x21) * (' ' - extraout_AL);
  uStack_a0 = ((addr >> (extraout_EAX & 0x1f)) << sVar4) >> sVar4;
  uVar3 = (this->policy).block_size;
  uStack_9c = uVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,(ulong)uVar3,
             &local_a9);
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_78._2_6_,CONCAT11(local_78[1],local_78[0]));
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
  puStack_40 = (pointer)local_78._8_8_;
  local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_68;
  local_48 = local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  log2((double)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  addr_00 = (addr >> (extraout_EAX_00 & 0x1f)) << (extraout_EAX_00 & 0x1f);
  if (addr_00 < uVar3 + addr_00) {
    lVar7 = 0;
    do {
      this_01 = this->lower_cache;
      if (this_01 == (Cache *)0x0) {
        uVar5 = MemoryManager::getByteNoCache(this->memory,addr_00 + (int)lVar7);
LAB_001039df:
        local_48[lVar7] = uVar5;
      }
      else {
        if (lVar7 != 0) {
          uVar5 = getByteCopy(this_01,addr_00 + (int)lVar7,(uint32_t *)0x0);
          goto LAB_001039df;
        }
        uVar5 = getByte(this_01,addr_00,cycles);
        *local_48 = uVar5;
      }
      uVar2 = (ulong)addr_00 + 1 + lVar7;
      lVar7 = lVar7 + 1;
    } while (uVar2 < uStack_9c + addr_00);
  }
  if (this->lower_cache == (Cache *)0x0) {
    puVar1 = &(this->statistics).cycle_cnt;
    *puVar1 = *puVar1 + 100;
    uVar6 = 100;
  }
  else {
    uVar6 = (this->lower_cache->policy).hit_latency;
    puVar1 = &(this->statistics).cycle_cnt;
    *puVar1 = *puVar1 + uVar6;
  }
  if (cycles != (uint32_t *)0x0) {
    *cycles = *cycles + uVar6;
  }
  uVar6 = getReplacementBlockId(this,uStack_a0);
  Block::Block((Block *)local_78,
               (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar6);
  if (((this->write_back == true) && (local_78[0] == true)) && (local_78[1] == true)) {
    writeBlockToLowerLevel(this,(Block *)local_78,cycles);
  }
  this_00 = &(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6].data;
  ((Block *)(this_00 + -1))->last_reference = local_98;
  *(bool *)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (bool)(char)local_a8;
  *(char *)((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1) = (char)((ushort)local_a8 >> 8);
  *(undefined2 *)
   ((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = uStack_a6;
  *(uint32_t *)
   ((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = uStack_a4;
  *(uint32_t *)
   &this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = uStack_a0;
  *(uint *)((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 4) = uStack_9c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_00,&local_90);
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60);
  }
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Cache::loadBlockFromLowerLevel(uint32_t addr, uint32_t *cycles) {
    // get block from memory or lower cache
    Block b;
    b.valid = true;
    b.dirty = false;
    b.tag = this->getTag(addr);
    b.id = this->getId(addr);
    b.size = this->policy.block_size;
    b.data = vector<uint8_t>(b.size);
    uint32_t bits = log2(b.size);
    uint32_t mask = ~((1 << bits) - 1);
    uint32_t block_begin_addr = addr & mask;
    for (uint32_t i = block_begin_addr; i < block_begin_addr + b.size; i++) {
        if (this->lower_cache == nullptr) {
            b.data[i - block_begin_addr] = this->memory->getByteNoCache(i);
        } else {
            if (i == block_begin_addr)
                b.data[i - block_begin_addr] = this->lower_cache->getByte(i, cycles);
            else
                b.data[i - block_begin_addr] = this->lower_cache->getByteCopy(i);
        }
    }
    if (this->lower_cache == nullptr) {
        this->statistics.cycle_cnt += 100;
        if (cycles)
            *cycles += 100;
    } else {
        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
        if (cycles)
            *cycles += this->lower_cache->policy.hit_latency;
    }

    // replace cache

    uint32_t replace_id = this->getReplacementBlockId(b.id);
    Block replace_block = this->blocks[replace_id];
    if (this->write_back && replace_block.valid && replace_block.dirty) {
        this->writeBlockToLowerLevel(replace_block, cycles);
    }
    this->blocks[replace_id] = b;
}